

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_compressionParameters *
ZSTD_adjustCParams_internal
          (ZSTD_compressionParameters *__return_storage_ptr__,ZSTD_compressionParameters cPar,
          unsigned_long_long srcSize,size_t dictSize,ZSTD_cParamMode_e mode,
          ZSTD_paramSwitch_e useRowMatchFinder)

{
  ZSTD_compressionParameters cParams;
  undefined1 auVar1 [20];
  uint uVar2;
  U32 UVar3;
  int iVar4;
  size_t sVar5;
  undefined8 in_stack_ffffffffffffff74;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  U32 maxHashLog;
  U32 maxRowHashLog;
  U32 rowLog;
  U32 maxShortCacheHashLog;
  U32 cycleLog;
  U32 dictAndWindowLog;
  U32 srcLog;
  U32 tSize;
  U64 maxWindowResize;
  U64 minSrcSize;
  ZSTD_paramSwitch_e useRowMatchFinder_local;
  ZSTD_cParamMode_e mode_local;
  size_t dictSize_local;
  unsigned_long_long srcSize_local;
  
  auVar1 = cPar._8_20_;
  cParams._20_8_ = in_stack_ffffffffffffff74;
  cParams.windowLog = auVar1._0_4_;
  cParams.chainLog = auVar1._4_4_;
  cParams.hashLog = auVar1._8_4_;
  cParams.searchLog = auVar1._12_4_;
  cParams.minMatch = auVar1._16_4_;
  sVar5 = ZSTD_checkCParams(cParams);
  if (sVar5 != 0) {
    __assert_fail("ZSTD_checkCParams(cPar)==0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x5bc,
                  "ZSTD_compressionParameters ZSTD_adjustCParams_internal(ZSTD_compressionParameters, unsigned long long, size_t, ZSTD_cParamMode_e, ZSTD_paramSwitch_e)"
                 );
  }
  _useRowMatchFinder_local = dictSize;
  dictSize_local = srcSize;
  switch(mode) {
  case ZSTD_cpm_noAttachDict:
  case ZSTD_cpm_unknown:
    break;
  case ZSTD_cpm_attachDict:
    _useRowMatchFinder_local = 0;
    break;
  case ZSTD_cpm_createCDict:
    if ((dictSize != 0) && (srcSize == 0xffffffffffffffff)) {
      dictSize_local = 0x201;
    }
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x5d5,
                  "ZSTD_compressionParameters ZSTD_adjustCParams_internal(ZSTD_compressionParameters, unsigned long long, size_t, ZSTD_cParamMode_e, ZSTD_paramSwitch_e)"
                 );
  }
  if ((dictSize_local < 0x40000001) && (_useRowMatchFinder_local < 0x40000001)) {
    uVar2 = (int)dictSize_local + (int)_useRowMatchFinder_local;
    if (uVar2 < 0x40) {
      local_74 = 6;
    }
    else {
      local_74 = ZSTD_highbit32(uVar2 - 1);
      local_74 = local_74 + 1;
    }
    if (local_74 < cPar.windowLog) {
      cPar.windowLog = local_74;
    }
  }
  if (dictSize_local != 0xffffffffffffffff) {
    UVar3 = ZSTD_dictAndWindowLog(cPar.windowLog,dictSize_local,_useRowMatchFinder_local);
    ZSTD_cycleLog(cPar.chainLog,cPar.strategy);
    if (UVar3 + 1 < cPar.hashLog) {
      cPar.hashLog = UVar3 + 1;
    }
  }
  if (cPar.windowLog < 10) {
    cPar.windowLog = 10;
  }
  if (((mode == ZSTD_cpm_createCDict) && (iVar4 = ZSTD_CDictIndicesAreTagged(&cPar), iVar4 != 0)) &&
     (0x18 < cPar.hashLog)) {
    cPar.hashLog = 0x18;
  }
  minSrcSize._0_4_ = useRowMatchFinder;
  if (useRowMatchFinder == ZSTD_ps_auto) {
    minSrcSize._0_4_ = ZSTD_ps_enable;
  }
  iVar4 = ZSTD_rowMatchFinderUsed(cPar.strategy,(ZSTD_paramSwitch_e)minSrcSize);
  if (iVar4 != 0) {
    if (cPar.searchLog < 6) {
      local_78 = cPar.searchLog;
    }
    else {
      local_78 = 6;
    }
    if (local_78 < 4) {
      local_7c = 4;
    }
    else {
      if (cPar.searchLog < 6) {
        local_80 = cPar.searchLog;
      }
      else {
        local_80 = 6;
      }
      local_7c = local_80;
    }
    if (cPar.hashLog < local_7c) {
      __assert_fail("cPar.hashLog >= rowLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x60b,
                    "ZSTD_compressionParameters ZSTD_adjustCParams_internal(ZSTD_compressionParameters, unsigned long long, size_t, ZSTD_cParamMode_e, ZSTD_paramSwitch_e)"
                   );
    }
    if (local_7c + 0x18 < cPar.hashLog) {
      cPar.hashLog = local_7c + 0x18;
    }
  }
  __return_storage_ptr__->windowLog = cPar.windowLog;
  __return_storage_ptr__->chainLog = cPar.chainLog;
  __return_storage_ptr__->hashLog = cPar.hashLog;
  __return_storage_ptr__->searchLog = cPar.searchLog;
  __return_storage_ptr__->minMatch = cPar.minMatch;
  __return_storage_ptr__->targetLength = cPar.targetLength;
  __return_storage_ptr__->strategy = cPar.strategy;
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_compressionParameters
ZSTD_adjustCParams_internal(ZSTD_compressionParameters cPar,
                            unsigned long long srcSize,
                            size_t dictSize,
                            ZSTD_cParamMode_e mode,
                            ZSTD_paramSwitch_e useRowMatchFinder)
{
    const U64 minSrcSize = 513; /* (1<<9) + 1 */
    const U64 maxWindowResize = 1ULL << (ZSTD_WINDOWLOG_MAX-1);
    assert(ZSTD_checkCParams(cPar)==0);

    switch (mode) {
    case ZSTD_cpm_unknown:
    case ZSTD_cpm_noAttachDict:
        /* If we don't know the source size, don't make any
         * assumptions about it. We will already have selected
         * smaller parameters if a dictionary is in use.
         */
        break;
    case ZSTD_cpm_createCDict:
        /* Assume a small source size when creating a dictionary
         * with an unknown source size.
         */
        if (dictSize && srcSize == ZSTD_CONTENTSIZE_UNKNOWN)
            srcSize = minSrcSize;
        break;
    case ZSTD_cpm_attachDict:
        /* Dictionary has its own dedicated parameters which have
         * already been selected. We are selecting parameters
         * for only the source.
         */
        dictSize = 0;
        break;
    default:
        assert(0);
        break;
    }

    /* resize windowLog if input is small enough, to use less memory */
    if ( (srcSize <= maxWindowResize)
      && (dictSize <= maxWindowResize) )  {
        U32 const tSize = (U32)(srcSize + dictSize);
        static U32 const hashSizeMin = 1 << ZSTD_HASHLOG_MIN;
        U32 const srcLog = (tSize < hashSizeMin) ? ZSTD_HASHLOG_MIN :
                            ZSTD_highbit32(tSize-1) + 1;
        if (cPar.windowLog > srcLog) cPar.windowLog = srcLog;
    }
    if (srcSize != ZSTD_CONTENTSIZE_UNKNOWN) {
        U32 const dictAndWindowLog = ZSTD_dictAndWindowLog(cPar.windowLog, (U64)srcSize, (U64)dictSize);
        U32 const cycleLog = ZSTD_cycleLog(cPar.chainLog, cPar.strategy);
        if (cPar.hashLog > dictAndWindowLog+1) cPar.hashLog = dictAndWindowLog+1;
        if (cycleLog > dictAndWindowLog)
            cPar.chainLog -= (cycleLog - dictAndWindowLog);
    }

    if (cPar.windowLog < ZSTD_WINDOWLOG_ABSOLUTEMIN)
        cPar.windowLog = ZSTD_WINDOWLOG_ABSOLUTEMIN;  /* minimum wlog required for valid frame header */

    /* We can't use more than 32 bits of hash in total, so that means that we require:
     * (hashLog + 8) <= 32 && (chainLog + 8) <= 32
     */
    if (mode == ZSTD_cpm_createCDict && ZSTD_CDictIndicesAreTagged(&cPar)) {
        U32 const maxShortCacheHashLog = 32 - ZSTD_SHORT_CACHE_TAG_BITS;
        if (cPar.hashLog > maxShortCacheHashLog) {
            cPar.hashLog = maxShortCacheHashLog;
        }
        if (cPar.chainLog > maxShortCacheHashLog) {
            cPar.chainLog = maxShortCacheHashLog;
        }
    }


    /* At this point, we aren't 100% sure if we are using the row match finder.
     * Unless it is explicitly disabled, conservatively assume that it is enabled.
     * In this case it will only be disabled for small sources, so shrinking the
     * hash log a little bit shouldn't result in any ratio loss.
     */
    if (useRowMatchFinder == ZSTD_ps_auto)
        useRowMatchFinder = ZSTD_ps_enable;

    /* We can't hash more than 32-bits in total. So that means that we require:
     * (hashLog - rowLog + 8) <= 32
     */
    if (ZSTD_rowMatchFinderUsed(cPar.strategy, useRowMatchFinder)) {
        /* Switch to 32-entry rows if searchLog is 5 (or more) */
        U32 const rowLog = BOUNDED(4, cPar.searchLog, 6);
        U32 const maxRowHashLog = 32 - ZSTD_ROW_HASH_TAG_BITS;
        U32 const maxHashLog = maxRowHashLog + rowLog;
        assert(cPar.hashLog >= rowLog);
        if (cPar.hashLog > maxHashLog) {
            cPar.hashLog = maxHashLog;
        }
    }

    return cPar;
}